

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
          (ParserRefImpl<Catch::clara::detail::Opt> *this,
          shared_ptr<Catch::clara::detail::BoundRef> *ref)

{
  shared_ptr<Catch::clara::detail::BoundRef> *ref_local;
  ParserRefImpl<Catch::clara::detail::Opt> *this_local;
  
  ComposableParserImpl<Catch::clara::detail::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::clara::detail::Opt>);
  (this->super_ComposableParserImpl<Catch::clara::detail::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_002507d8;
  this->m_optionality = Optional;
  std::shared_ptr<Catch::clara::detail::BoundRef>::shared_ptr(&this->m_ref,ref);
  ::std::__cxx11::string::string((string *)&this->m_hint);
  ::std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

explicit ParserRefImpl( std::shared_ptr<BoundRef> const &ref ) : m_ref( ref ) {}